

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O0

int __thiscall
Assimp::IOStreamBuffer<char>::open(IOStreamBuffer<char> *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined4 extraout_var;
  IOStreamBuffer<char> *pIVar2;
  IOStream *stream_local;
  IOStreamBuffer<char> *this_local;
  
  if (this->m_stream == (IOStream *)0x0) {
    if (__file == (char *)0x0) {
      this_local._7_1_ = 0;
      pIVar2 = (IOStreamBuffer<char> *)0x0;
    }
    else {
      this->m_stream = (IOStream *)__file;
      iVar1 = (*this->m_stream->_vptr_IOStream[6])(this->m_stream,__file,___oflag);
      this->m_filesize = CONCAT44(extraout_var,iVar1);
      if (this->m_filesize == 0) {
        this_local._7_1_ = 0;
        pIVar2 = this;
      }
      else {
        if (this->m_filesize < this->m_cacheSize) {
          this->m_cacheSize = this->m_filesize;
        }
        this->m_numBlocks = this->m_filesize / this->m_cacheSize;
        pIVar2 = (IOStreamBuffer<char> *)(this->m_filesize / this->m_cacheSize);
        if (this->m_filesize % this->m_cacheSize != 0) {
          this->m_numBlocks = this->m_numBlocks + 1;
          pIVar2 = this;
        }
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    pIVar2 = (IOStreamBuffer<char> *)0x0;
  }
  return (int)CONCAT71((int7)((ulong)pIVar2 >> 8),this_local._7_1_);
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::open( IOStream *stream ) {
    //  file still opened!
    if ( nullptr != m_stream ) {
        return false;
    }

    //  Invalid stream pointer
    if ( nullptr == stream ) {
        return false;
    }

    m_stream = stream;
    m_filesize = m_stream->FileSize();
    if ( m_filesize == 0 ) {
        return false;
    }
    if ( m_filesize < m_cacheSize ) {
        m_cacheSize = m_filesize;
    }

    m_numBlocks = m_filesize / m_cacheSize;
    if ( ( m_filesize % m_cacheSize ) > 0 ) {
        m_numBlocks++;
    }

    return true;
}